

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiInputTextFlags InputScalar_DefaultCharsFilter(ImGuiDataType data_type,char *format)

{
  char cVar1;
  size_t sVar2;
  char *in_RSI;
  int in_EDI;
  char format_last_char;
  ImGuiInputTextFlags local_4;
  
  if ((in_EDI == 8) || (in_EDI == 9)) {
    local_4 = 0x20000;
  }
  else {
    if (*in_RSI == '\0') {
      cVar1 = '\0';
    }
    else {
      sVar2 = strlen(in_RSI);
      cVar1 = in_RSI[sVar2 - 1];
    }
    local_4 = 1;
    if (cVar1 == 'x' || cVar1 == 'X') {
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static inline ImGuiInputTextFlags InputScalar_DefaultCharsFilter(ImGuiDataType data_type, const char* format)
{
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        return ImGuiInputTextFlags_CharsScientific;
    const char format_last_char = format[0] ? format[strlen(format) - 1] : 0;
    return (format_last_char == 'x' || format_last_char == 'X') ? ImGuiInputTextFlags_CharsHexadecimal : ImGuiInputTextFlags_CharsDecimal;
}